

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O3

RegOffsetInfo * mpp_service_next_reg_offset(MppDevMppService *p)

{
  RegOffsetInfo *pRVar1;
  uint uVar2;
  RegOffsetInfo *pRVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = p->reg_offset_max;
  iVar6 = p->reg_offset_count;
  uVar2 = p->reg_offset_pos;
  iVar4 = uVar2 + iVar6;
  if ((int)uVar5 <= iVar4) {
    pRVar1 = p->reg_offset_info;
    pRVar3 = pRVar1;
    if (((byte)mpp_device_debug & 0x40) != 0) {
      _mpp_log_l(4,"mpp_serivce","enlarge reg offset count %d -> %d\n",(char *)0x0,(ulong)uVar5,
                 (ulong)(uVar5 * 2));
      uVar5 = p->reg_offset_max;
      pRVar3 = p->reg_offset_info;
    }
    pRVar3 = (RegOffsetInfo *)
             mpp_osal_realloc("mpp_service_next_reg_offset",pRVar3,(long)(int)(uVar5 * 2) << 3);
    p->reg_offset_info = pRVar3;
    if (pRVar3 == (RegOffsetInfo *)0x0) {
      _mpp_log_l(2,"mpp_serivce","failed to enlarge request buffer\n","mpp_service_next_reg_offset")
      ;
      return (RegOffsetInfo *)0x0;
    }
    if (pRVar1 != pRVar3) {
      _mpp_log_l(3,"mpp_serivce","enlarge reg offset buffer and get different pointer\n",
                 "mpp_service_next_reg_offset");
    }
    p->reg_offset_max = p->reg_offset_max << 1;
    iVar6 = p->reg_offset_count;
    uVar2 = p->reg_offset_pos;
    iVar4 = uVar2 + iVar6;
  }
  pRVar1 = p->reg_offset_info;
  if (((byte)mpp_device_debug & 0x40) != 0) {
    _mpp_log_l(4,"mpp_serivce","reg offset %d : %d\n",(char *)0x0,(ulong)uVar2);
    iVar6 = p->reg_offset_count;
  }
  p->reg_offset_count = iVar6 + 1;
  return pRVar1 + iVar4;
}

Assistant:

RegOffsetInfo *mpp_service_next_reg_offset(MppDevMppService *p)
{
    RegOffsetInfo *info = NULL;

    if (p->reg_offset_count + p->reg_offset_pos >= p->reg_offset_max) {
        RegOffsetInfo *orig = p->reg_offset_info;

        mpp_dev_dbg_msg("enlarge reg offset count %d -> %d\n",
                        p->reg_offset_max, p->reg_offset_max * 2);
        p->reg_offset_info = mpp_realloc(p->reg_offset_info, RegOffsetInfo, p->reg_offset_max * 2);
        if (NULL == p->reg_offset_info) {
            mpp_err_f("failed to enlarge request buffer\n");
            return NULL;
        }
        if (orig != p->reg_offset_info)
            mpp_logw_f("enlarge reg offset buffer and get different pointer\n");

        p->reg_offset_max *= 2;
    }

    info = &p->reg_offset_info[p->reg_offset_count + p->reg_offset_pos];
    mpp_dev_dbg_msg("reg offset %d : %d\n", p->reg_offset_pos, p->reg_offset_count);
    p->reg_offset_count++;

    return info;
}